

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Free_Games.cpp
# Opt level: O3

double __thiscall Free_Games::Free_GamesWin(Free_Games *this,double *credits,uint *bet)

{
  pointer piVar1;
  pointer pvVar2;
  pointer pvVar3;
  double *credits_00;
  ostream *this_00;
  long *plVar4;
  int iVar5;
  int i;
  int iVar6;
  pointer pvVar7;
  bool isInFreeGames;
  uint betInFreeGames;
  string p;
  Matrix mymatrix;
  Bet betFreesSpin;
  Start startFreeSpin;
  PaytableWisePharaohs5 paytableForGame;
  bool local_159;
  uint *local_158;
  uint local_14c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_148;
  char *local_130;
  long local_128;
  char local_120;
  undefined7 uStack_11f;
  double *local_110;
  Matrix local_108;
  Bet local_f0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_e0;
  Start local_c8;
  PaytableWisePharaohs5 local_a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_158 = bet;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You Won 50 Euros!",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"They will be transfered in Credit Field After Free Games!",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"3x Multiplier! on every line",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  local_14c = 0;
  local_130 = &local_120;
  local_128 = 0;
  local_120 = '\0';
  Start::Start(&local_c8);
  Matrix::Matrix(&local_108);
  Bet::Bet(&local_f0);
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_159 = true;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_e0,&local_148);
  PaytableWisePharaohs5::PaytableWisePharaohs5(&local_a0,&local_e0,*credits,*local_158,local_159);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_e0);
  Matrix::getVectorMatrix(&local_78,&local_108);
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_148.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_148.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_78);
  iVar5 = 1;
  iVar6 = 0;
  local_110 = credits;
  do {
    credits_00 = local_110;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Current Game: ",0xe);
    this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," of ",4);
    plVar4 = (long *)std::ostream::operator<<(this_00,0xf);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'v\' to Start a Game!",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)&local_130);
    if ((*local_130 == 'v') && (local_128 == 1)) {
      Start::takeCreditsWithBet(&local_c8,credits_00,&local_14c);
      Matrix::RandomNumbersInMatrix(&local_60,&local_108,&local_148);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_60);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---------------------------------------------",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      Matrix::outPutMatrix(&local_108,&local_148);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---------------------------------------------",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      Start::checkForCreditsAndBet(&local_c8,credits_00,local_158);
      Start::outputCreditsAndBetCurrentFreeGames(&local_c8,credits_00,local_158);
      PaytableWisePharaohs5::PaytableWisePharaohs5Win
                (&local_a0,&local_148,credits_00,local_158,&local_159);
      iVar5 = iVar5 + 1;
    }
    pvVar3 = local_148.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar2 = local_148.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = local_148.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_148.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_148.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        piVar1 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar1 != (pointer)0x0) {
          operator_delete(piVar1,(long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)piVar1);
        }
        pvVar7 = pvVar7 + 1;
      } while (pvVar7 != pvVar3);
      local_148.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0xf);
  local_158 = (uint *)*local_110;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_a0._myVectorInPaytableWisePharaohs);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_148);
  Bet::~Bet(&local_f0);
  Matrix::~Matrix(&local_108);
  Start::~Start(&local_c8);
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
  return (double)local_158;
}

Assistant:

double Free_Games::Free_GamesWin(double& credits, unsigned int  &bet) {
	//int currentBet = bet;
	//no bet in Free Spins
	//bet = 0;
	std::cout << "You Won 50 Euros!" << std::endl;
	std::cout << "They will be transfered in Credit Field After Free Games!" << std::endl;
	std::cout << "3x Multiplier! on every line" << std::endl;
	unsigned int betInFreeGames = 0;
	std::string p;
	Start startFreeSpin;
	Matrix mymatrix;
	Bet betFreesSpin;
	int currentGame = 1;
	std::vector<std::vector<int>>myVectorInStart;
	bool isInFreeGames = true;
	PaytableWisePharaohs5 paytableForGame(myVectorInStart, credits, bet, isInFreeGames);
	myVectorInStart = mymatrix.getVectorMatrix();
	//clears screen
	//if (system("CLS")) system("clear");
	for (int i = 0; i < FreeGamesSize; ++i) {
		std::cout << "Current Game: " << currentGame << " of " << FreeGamesSize << std::endl;
		std::cout << "Press 'v' to Start a Game!" << std::endl;
		std::cin >> p;
		if (p[0] == 'v' && p.size() == 1) {
			startFreeSpin.takeCreditsWithBet(credits, betInFreeGames);
			//need to change matrix with 6 figures! --- DONT!
			mymatrix.RandomNumbersInMatrix(myVectorInStart);
			
			std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			mymatrix.outPutMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl;
			startFreeSpin.checkForCreditsAndBet(credits, bet);
			startFreeSpin.outputCreditsAndBetCurrentFreeGames(credits, bet);
			paytableForGame.PaytableWisePharaohs5Win(myVectorInStart, credits, bet, isInFreeGames);
			currentGame++;
		}
		/*else {
			if (i != 0) {
				i--;
			}
		}*/
		myVectorInStart.clear();
	}
	
	return credits ;
}